

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-extract.c
# Opt level: O2

void test_nested(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uVar6;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar7;
  int i32;
  char *utf8;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  uVar3 = bson_bcon_magic();
  uVar3 = bcon_new(0,"hello","world","foo","{","bar",uVar3,CONCAT44(uVar6,0xf),CONCAT44(uVar7,10),
                   "}",0);
  uVar4 = bson_bcone_magic();
  cVar1 = bcon_extract(uVar3,"hello",uVar4,0,&utf8,"foo","{","bar",uVar4,0xf,&i32,"}",0);
  if (cVar1 == '\0') {
    pcVar5 = 
    "BCON_EXTRACT (bcon, \"hello\", BCONE_UTF8 (utf8), \"foo\", \"{\", \"bar\", BCONE_INT32 (i32), \"}\")"
    ;
    uVar3 = 0x1af;
  }
  else {
    iVar2 = strcmp("world",utf8);
    if (iVar2 == 0) {
      if (i32 == 10) {
        bson_destroy(uVar3);
        return;
      }
      pcVar5 = "i32 == 10";
      uVar3 = 0x1b2;
    }
    else {
      pcVar5 = "strcmp (\"world\", utf8) == 0";
      uVar3 = 0x1b1;
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bcon-extract.c"
          ,uVar3,"test_nested",pcVar5);
  abort();
}

Assistant:

static void
test_nested (void)
{
   const char *utf8;
   int i32;

   bson_t *bcon =
      BCON_NEW ("hello", "world", "foo", "{", "bar", BCON_INT32 (10), "}");

   BSON_ASSERT (BCON_EXTRACT (bcon,
                         "hello",
                         BCONE_UTF8 (utf8),
                         "foo",
                         "{",
                         "bar",
                         BCONE_INT32 (i32),
                         "}"));

   BSON_ASSERT (strcmp ("world", utf8) == 0);
   BSON_ASSERT (i32 == 10);

   bson_destroy (bcon);
}